

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O2

unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> __thiscall
verilogAST::AssignInliner::process_assign<verilogAST::BlockingAssign>
          (AssignInliner *this,
          unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
          *node)

{
  long *plVar1;
  _Alloc_hider _Var2;
  _func_int **pp_Var3;
  long *in_RDX;
  bool remove;
  string key;
  bool local_69;
  long *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_class_24_3_01e97c98 local_40;
  
  local_68 = *(long **)(*in_RDX + 0x20);
  *(undefined8 *)(*in_RDX + 0x20) = 0;
  (**(code **)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BlockingAssign_*,_std::default_delete<verilogAST::BlockingAssign>_>
              .super__Head_base<0UL,_verilogAST::BlockingAssign_*,_false>._M_head_impl)(&local_60);
  _Var2._M_p = local_60._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x20);
  *(pointer *)(*in_RDX + 0x20) = _Var2._M_p;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x10))();
    }
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 0x10))();
  }
  local_68 = (long *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:217:18)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(*in_RDX + 0x18)]._M_data)
            (&local_60,(anon_class_1_0_00000001 *)&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(*in_RDX + 0x10));
  local_40.remove = &local_69;
  local_69 = false;
  local_40.this = (AssignInliner *)node;
  local_40.key = &local_60;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:221:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(*in_RDX + 0x18)]._M_data)
            (&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(*in_RDX + 0x10));
  if (local_69 == false) {
    pp_Var3 = (_func_int **)*in_RDX;
    *in_RDX = 0;
  }
  else {
    pp_Var3 = (_func_int **)0x0;
  }
  (this->super_Transformer)._vptr_Transformer = pp_Var3;
  std::__cxx11::string::~string((string *)&local_60);
  return (__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> AssignInliner::process_assign(std::unique_ptr<T> node) {
  node->value = this->visit(std::move(node->value));
  std::string key =
      std::visit([](auto&& value) -> std::string { return value->toString(); },
                 node->target);
  bool remove = false;
  std::visit(
      [&](auto&& value) {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          if (this->can_inline(key) && this->non_input_ports.count(key) == 0) {
            remove = true;
          } else if (this->inlined_outputs.count(ptr->toString())) {
            remove = true;
          };
        }
      },
      node->target);
  if (remove) {
    return std::unique_ptr<T>{};
  }
  return node;
}